

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_data.hpp
# Opt level: O2

LogicalType * __thiscall
duckdb::BoundParameterData::GetDefaultType
          (LogicalType *__return_storage_ptr__,BoundParameterData *this,LogicalType *type)

{
  string local_40;
  
  if ((this->value).type_.id_ == VARCHAR) {
    StringType::GetCollation_abi_cxx11_(&local_40,(StringType *)type,type);
    ::std::__cxx11::string::~string((string *)&local_40);
    if (local_40._M_string_length == 0) {
      LogicalType::LogicalType(__return_storage_ptr__,STRING_LITERAL);
      return __return_storage_ptr__;
    }
  }
  LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
  return __return_storage_ptr__;
}

Assistant:

LogicalType GetDefaultType(const LogicalType &type) {
		if (value.type().id() == LogicalTypeId::VARCHAR && StringType::GetCollation(type).empty()) {
			return LogicalTypeId::STRING_LITERAL;
		}
		return value.type();
	}